

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::InstructionFolder::FoldBinaryBooleanOpToConstant
          (InstructionFolder *this,Instruction *inst,function<unsigned_int_(unsigned_int)> *id_map,
          uint32_t *result)

{
  Op OVar1;
  IRContext *this_00;
  ConstantManager *this_01;
  uint **ppuVar2;
  uint32_t i;
  uint id;
  int iVar3;
  uint32_t uVar4;
  Operand *pOVar5;
  uint **ppuVar6;
  Constant *pCVar7;
  undefined4 extraout_var;
  long lVar9;
  BoolConstant *constants [2];
  uint local_54;
  uint32_t *local_50;
  long alStack_48 [3];
  long lVar8;
  
  OVar1 = inst->opcode_;
  this_00 = this->context_;
  local_50 = result;
  if ((this_00->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
    IRContext::BuildConstantManager(this_00);
  }
  this_01 = (this_00->constant_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>._M_head_impl;
  lVar9 = 0;
  do {
    pOVar5 = Instruction::GetInOperand(inst,(uint32_t)lVar9);
    if (pOVar5->type != SPV_OPERAND_TYPE_ID) {
      return false;
    }
    ppuVar2 = (uint **)(pOVar5->words).large_data_._M_t.
                       super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl;
    ppuVar6 = &(pOVar5->words).small_data_;
    if (ppuVar2 != (uint **)0x0) {
      ppuVar6 = ppuVar2;
    }
    local_54 = **ppuVar6;
    if ((id_map->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    id = (*id_map->_M_invoker)((_Any_data *)id_map,&local_54);
    pCVar7 = analysis::ConstantManager::FindDeclaredConstant(this_01,id);
    if (pCVar7 == (Constant *)0x0) {
      lVar8 = 0;
    }
    else {
      iVar3 = (*pCVar7->_vptr_Constant[0x10])(pCVar7);
      lVar8 = CONCAT44(extraout_var,iVar3);
    }
    alStack_48[lVar9] = lVar8;
    lVar9 = lVar9 + 1;
  } while (lVar9 == 1);
  if (OVar1 == OpLogicalOr) {
    lVar9 = 0;
    do {
      if ((alStack_48[lVar9] != 0) && (*(char *)(alStack_48[lVar9] + 0x28) != '\0')) {
        uVar4 = 1;
        goto LAB_005b068a;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 == 1);
  }
  else if (OVar1 == OpLogicalAnd) {
    lVar9 = 0;
    do {
      if ((alStack_48[lVar9] != 0) && (*(char *)(alStack_48[lVar9] + 0x28) != '\x01')) {
        uVar4 = 0;
LAB_005b068a:
        *local_50 = uVar4;
        return true;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 == 1);
  }
  return false;
}

Assistant:

bool InstructionFolder::FoldBinaryBooleanOpToConstant(
    Instruction* inst, const std::function<uint32_t(uint32_t)>& id_map,
    uint32_t* result) const {
  spv::Op opcode = inst->opcode();
  analysis::ConstantManager* const_manger = context_->get_constant_mgr();

  uint32_t ids[2];
  const analysis::BoolConstant* constants[2];
  for (uint32_t i = 0; i < 2; i++) {
    const Operand* operand = &inst->GetInOperand(i);
    if (operand->type != SPV_OPERAND_TYPE_ID) {
      return false;
    }
    ids[i] = id_map(operand->words[0]);
    const analysis::Constant* constant =
        const_manger->FindDeclaredConstant(ids[i]);
    constants[i] = (constant != nullptr ? constant->AsBoolConstant() : nullptr);
  }

  switch (opcode) {
    // Logical
    case spv::Op::OpLogicalOr:
      for (uint32_t i = 0; i < 2; i++) {
        if (constants[i] != nullptr) {
          if (constants[i]->value()) {
            *result = true;
            return true;
          }
        }
      }
      break;
    case spv::Op::OpLogicalAnd:
      for (uint32_t i = 0; i < 2; i++) {
        if (constants[i] != nullptr) {
          if (!constants[i]->value()) {
            *result = false;
            return true;
          }
        }
      }
      break;

    default:
      break;
  }
  return false;
}